

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::VectorAccumulator::getStdDev(VectorAccumulator *this,ResultType *ret)

{
  double *pdVar1;
  Vector<double,_3U> *in_RSI;
  double dVar2;
  ResultType var;
  ResultType *in_stack_ffffffffffffffd8;
  VectorAccumulator *in_stack_ffffffffffffffe0;
  
  Vector3<double>::Vector3((Vector3<double> *)0x3036f1);
  getVariance(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pdVar1 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffffd8,0);
  dVar2 = sqrt(*pdVar1);
  pdVar1 = Vector<double,_3U>::operator[](in_RSI,0);
  *pdVar1 = dVar2;
  pdVar1 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffffd8,1);
  dVar2 = sqrt(*pdVar1);
  pdVar1 = Vector<double,_3U>::operator[](in_RSI,1);
  *pdVar1 = dVar2;
  pdVar1 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xffffffffffffffd8,2);
  dVar2 = sqrt(*pdVar1);
  pdVar1 = Vector<double,_3U>::operator[](in_RSI,2);
  *pdVar1 = dVar2;
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      ret[0] = sqrt(var[0]);
      ret[1] = sqrt(var[1]);
      ret[2] = sqrt(var[2]);
      return;
    }